

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int balance_deeper(MemPage *pRoot,MemPage **ppChild)

{
  BtShared *pBt_00;
  BtShared *pBt;
  MemPage *pMStack_30;
  Pgno pgnoChild;
  MemPage *pChild;
  MemPage **ppMStack_20;
  int rc;
  MemPage **ppChild_local;
  MemPage *pRoot_local;
  
  pMStack_30 = (MemPage *)0x0;
  pBt._4_4_ = 0;
  pBt_00 = pRoot->pBt;
  ppMStack_20 = ppChild;
  ppChild_local = (MemPage **)pRoot;
  pChild._4_4_ = sqlite3PagerWrite(pRoot->pDbPage);
  if (pChild._4_4_ == 0) {
    pChild._4_4_ = allocateBtreePage(pBt_00,&stack0xffffffffffffffd0,(Pgno *)((long)&pBt + 4),
                                     *(Pgno *)((long)ppChild_local + 4),'\0');
    copyNodeContent((MemPage *)ppChild_local,pMStack_30,(int *)((long)&pChild + 4));
    if (pBt_00->autoVacuum != '\0') {
      ptrmapPut(pBt_00,pBt._4_4_,'\x05',*(Pgno *)((long)ppChild_local + 4),
                (int *)((long)&pChild + 4));
    }
  }
  if (pChild._4_4_ == 0) {
    memcpy(pMStack_30->aiOvfl,(void *)((long)ppChild_local + 0x1c),
           (ulong)*(byte *)((long)ppChild_local + 0xc) << 1);
    memcpy(pMStack_30->apOvfl,ppChild_local + 5,(ulong)*(byte *)((long)ppChild_local + 0xc) << 3);
    pMStack_30->nOverflow = *(u8 *)((long)ppChild_local + 0xc);
    zeroPage((MemPage *)ppChild_local,*pMStack_30->aData & 0xfffffff7);
    sqlite3Put4byte((uchar *)((long)ppChild_local[10]->aiOvfl +
                             (long)(int)(*(byte *)((long)ppChild_local + 9) + 8) + -0x1c),pBt._4_4_)
    ;
    *ppMStack_20 = pMStack_30;
    pRoot_local._4_4_ = 0;
  }
  else {
    *ppMStack_20 = (MemPage *)0x0;
    releasePage(pMStack_30);
    pRoot_local._4_4_ = pChild._4_4_;
  }
  return pRoot_local._4_4_;
}

Assistant:

static int balance_deeper(MemPage *pRoot, MemPage **ppChild){
  int rc;                        /* Return value from subprocedures */
  MemPage *pChild = 0;           /* Pointer to a new child page */
  Pgno pgnoChild = 0;            /* Page number of the new child page */
  BtShared *pBt = pRoot->pBt;    /* The BTree */

  assert( pRoot->nOverflow>0 );
  assert( sqlite3_mutex_held(pBt->mutex) );

  /* Make pRoot, the root page of the b-tree, writable. Allocate a new 
  ** page that will become the new right-child of pPage. Copy the contents
  ** of the node stored on pRoot into the new child page.
  */
  rc = sqlite3PagerWrite(pRoot->pDbPage);
  if( rc==SQLITE_OK ){
    rc = allocateBtreePage(pBt,&pChild,&pgnoChild,pRoot->pgno,0);
    copyNodeContent(pRoot, pChild, &rc);
    if( ISAUTOVACUUM ){
      ptrmapPut(pBt, pgnoChild, PTRMAP_BTREE, pRoot->pgno, &rc);
    }
  }
  if( rc ){
    *ppChild = 0;
    releasePage(pChild);
    return rc;
  }
  assert( sqlite3PagerIswriteable(pChild->pDbPage) );
  assert( sqlite3PagerIswriteable(pRoot->pDbPage) );
  assert( pChild->nCell==pRoot->nCell || CORRUPT_DB );

  TRACE(("BALANCE: copy root %d into %d\n", pRoot->pgno, pChild->pgno));

  /* Copy the overflow cells from pRoot to pChild */
  memcpy(pChild->aiOvfl, pRoot->aiOvfl,
         pRoot->nOverflow*sizeof(pRoot->aiOvfl[0]));
  memcpy(pChild->apOvfl, pRoot->apOvfl,
         pRoot->nOverflow*sizeof(pRoot->apOvfl[0]));
  pChild->nOverflow = pRoot->nOverflow;

  /* Zero the contents of pRoot. Then install pChild as the right-child. */
  zeroPage(pRoot, pChild->aData[0] & ~PTF_LEAF);
  put4byte(&pRoot->aData[pRoot->hdrOffset+8], pgnoChild);

  *ppChild = pChild;
  return SQLITE_OK;
}